

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O0

int la_adsc_reporting_interval_parse(void *dest,uint8_t *buf,uint32_t len)

{
  char *pcVar1;
  int in_EDX;
  byte *in_RSI;
  long in_RDI;
  uint8_t sf;
  la_adsc_report_interval_req_t *ri;
  la_adsc_tag_t *t;
  uint32_t tag_len;
  size_t in_stack_00000030;
  char local_31;
  int local_4;
  
  if (in_EDX == 0) {
    local_4 = -1;
  }
  else {
    pcVar1 = (char *)la_xcalloc(in_stack_00000030,(size_t)dest,(char *)buf,len,(char *)t);
    *(char **)(in_RDI + 0x10) = pcVar1;
    local_31 = (char)((int)(*in_RSI & 0xc0) >> 6);
    if (local_31 == '\x02') {
      local_31 = '\b';
    }
    else if (local_31 == '\x03') {
      local_31 = '@';
    }
    *pcVar1 = local_31;
    pcVar1[1] = *in_RSI & 0x3f;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

LA_ADSC_PARSER_FUN(la_adsc_reporting_interval_parse) {
	uint32_t tag_len = 1;
	la_adsc_tag_t *t = dest;
	LA_ADSC_CHECK_LEN(t->tag, len, tag_len);
	LA_NEW(la_adsc_report_interval_req_t, ri);
	t->data = ri;
	uint8_t sf = (buf[0] & 0xc0) >> 6;
	// convert scaling factor to multiplier value
	if(sf == 2)
		sf = 8;
	else if(sf == 3)
		sf = 64;
	ri->scaling_factor = sf;
	ri->rate = buf[0] & 0x3f;
	la_debug_print(D_INFO, "SF=%u rate=%u\n", ri->scaling_factor, ri->rate);
	return tag_len;
}